

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# httplib.h
# Opt level: O3

EncodingType httplib::detail::encoding_type(Request *req,Response *res)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  long lVar2;
  uint uVar3;
  char *pcVar4;
  bool bVar5;
  pair<std::_Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::_Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  pVar6;
  allocator local_69;
  key_type local_68;
  long *local_48;
  long local_40;
  long local_38 [2];
  
  paVar1 = &local_68.field_2;
  local_68._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_68,"Content-Type","");
  pVar6 = std::
          _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_httplib::detail::ci,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
          ::equal_range(&(res->headers)._M_t,&local_68);
  if (pVar6.first._M_node._M_node == pVar6.second._M_node._M_node) {
    pcVar4 = "";
  }
  else {
    pcVar4 = *(char **)(pVar6.first._M_node._M_node + 2);
  }
  std::__cxx11::string::string((string *)&local_48,pcVar4,&local_69);
  if (local_40 == 0) {
    uVar3 = 0;
  }
  else {
    lVar2 = 0;
    uVar3 = 0;
    do {
      uVar3 = (uint)*(byte *)((long)local_48 + lVar2) ^ uVar3 * 0x21 & 0x3ffffff;
      lVar2 = lVar2 + 1;
    } while (local_40 != lVar2);
    bVar5 = true;
    if (uVar3 < 0x2348aed) {
      if (((uVar3 == 0xcb462) || (uVar3 == 0x1accd8)) || (uVar3 == 0xa74526)) goto LAB_0014dced;
    }
    else if (((uVar3 == 0x2348aed) || (uVar3 == 0x2bb6a6c)) || (uVar3 == 0x2c726b2))
    goto LAB_0014dced;
  }
  bVar5 = false;
  lVar2 = std::__cxx11::string::rfind((char *)&local_48,0x164e42,0);
  if (lVar2 == 0) {
    bVar5 = uVar3 != 0xb66a0f;
  }
LAB_0014dced:
  if (local_48 != local_38) {
    operator_delete(local_48,local_38[0] + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_68._M_dataplus._M_p != paVar1) {
    operator_delete(local_68._M_dataplus._M_p,local_68.field_2._M_allocated_capacity + 1);
  }
  if (bVar5) {
    local_68._M_dataplus._M_p = (pointer)paVar1;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_68,"Accept-Encoding","");
    pVar6 = std::
            _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_httplib::detail::ci,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
            ::equal_range(&(req->headers)._M_t,&local_68);
    if (pVar6.first._M_node._M_node == pVar6.second._M_node._M_node) {
      pcVar4 = "";
    }
    else {
      pcVar4 = *(char **)(pVar6.first._M_node._M_node + 2);
    }
    std::__cxx11::string::string((string *)&local_48,pcVar4,&local_69);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_68._M_dataplus._M_p != paVar1) {
      operator_delete(local_68._M_dataplus._M_p,local_68.field_2._M_allocated_capacity + 1);
    }
    if (local_48 != local_38) {
      operator_delete(local_48,local_38[0] + 1);
    }
  }
  return None;
}

Assistant:

inline EncodingType encoding_type(const Request &req, const Response &res) {
  auto ret =
      detail::can_compress_content_type(res.get_header_value("Content-Type"));
  if (!ret) { return EncodingType::None; }

  const auto &s = req.get_header_value("Accept-Encoding");
  (void)(s);

#ifdef CPPHTTPLIB_BROTLI_SUPPORT
  // TODO: 'Accept-Encoding' has br, not br;q=0
  ret = s.find("br") != std::string::npos;
  if (ret) { return EncodingType::Brotli; }
#endif

#ifdef CPPHTTPLIB_ZLIB_SUPPORT
  // TODO: 'Accept-Encoding' has gzip, not gzip;q=0
  ret = s.find("gzip") != std::string::npos;
  if (ret) { return EncodingType::Gzip; }
#endif

  return EncodingType::None;
}